

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

void redrawSystem(int n)

{
  uint uVar1;
  ulong uVar2;
  undefined4 in_register_0000003c;
  long lVar3;
  
  clear(CONCAT44(in_register_0000003c,n));
  refresh();
  uVar1 = 0;
  lVar3 = 0;
  while( true ) {
    uVar2 = (ulong)uVar1;
    if ((ulong)(((long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0xa8) <= uVar2) break;
    box(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar2].w_main,0,0);
    box(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar2].w_code,0,0);
    box(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar2].w_divider,0,0);
    wrefresh(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar2].w_main);
    wrefresh(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar2].w_reg);
    wrefresh(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar2].w_code);
    wrefresh(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar2].w_divider);
    for (lVar3 = (long)(int)lVar3; lVar3 < 4; lVar3 = lVar3 + 1) {
      if (grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar2].arrows[lVar3] != (arrowType *)0x0) {
        wrefresh(grid.super__Vector_base<node,_std::allocator<node>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar2].arrows[lVar3]->win);
      }
    }
    uVar1 = uVar1 + 1;
  }
  drawSystemContent();
  refresh();
  return;
}

Assistant:

void redrawSystem(int n){
  clear();
  refresh();
  for(unsigned int i=0;i<grid.size();i++){
      box(grid[i].w_main,0,0);
      box(grid[i].w_code,0,0);
      box(grid[i].w_divider,0,0);
      wrefresh(grid[i].w_main);
      wrefresh(grid[i].w_reg);
      wrefresh(grid[i].w_code);
      wrefresh(grid[i].w_divider);
      for(int j;j<4;j++){
	if(grid[i].arrows[j])
	  wrefresh(grid[i].arrows[j]->win);
      }
  }
  drawSystemContent();
  refresh();
  return;
}